

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

void __thiscall
Fl_Text_Buffer::redisplay_selection
          (Fl_Text_Buffer *this,Fl_Text_Selection *oldSelection,Fl_Text_Selection *newSelection)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int pos;
  long lVar5;
  int iVar6;
  int pos_00;
  long lVar7;
  
  iVar1 = newSelection->mStart;
  iVar6 = newSelection->mEnd;
  if (oldSelection->mSelected == false) {
    if (newSelection->mSelected == false) {
      return;
    }
  }
  else {
    pos_00 = oldSelection->mStart;
    iVar2 = oldSelection->mEnd;
    if (newSelection->mSelected == false) {
      iVar6 = iVar2 - pos_00;
      goto LAB_001cb6d2;
    }
    if (pos_00 <= iVar6 && iVar1 <= iVar2) {
      iVar3 = iVar6;
      if (iVar6 < iVar2) {
        iVar3 = iVar2;
      }
      iVar4 = iVar6;
      if (iVar2 < iVar6) {
        iVar4 = iVar2;
      }
      if (pos_00 != iVar1) {
        pos = iVar1;
        if (pos_00 < iVar1) {
          pos = pos_00;
        }
        lVar5 = (long)pos_00 - (long)iVar1;
        lVar7 = -lVar5;
        if (0 < lVar5) {
          lVar7 = lVar5;
        }
        call_modify_callbacks(this,pos,0,0,(int)lVar7,(char *)0x0);
      }
      if (iVar2 == iVar6) {
        return;
      }
      iVar6 = iVar3 - iVar4;
      pos_00 = iVar4;
      goto LAB_001cb6d2;
    }
    call_modify_callbacks(this,pos_00,0,0,iVar2 - pos_00,(char *)0x0);
  }
  iVar6 = iVar6 - iVar1;
  pos_00 = iVar1;
LAB_001cb6d2:
  call_modify_callbacks(this,pos_00,0,0,iVar6,(char *)0x0);
  return;
}

Assistant:

void Fl_Text_Buffer::redisplay_selection(Fl_Text_Selection *
					   oldSelection,
					   Fl_Text_Selection *
					   newSelection) const
{
  int oldStart, oldEnd, newStart, newEnd, ch1Start, ch1End, ch2Start,
  ch2End;
  
  /* If either selection is rectangular, add an additional character to
   the end of the selection to request the redraw routines to wipe out
   the parts of the selection beyond the end of the line */
  oldStart = oldSelection->mStart;
  newStart = newSelection->mStart;
  oldEnd = oldSelection->mEnd;
  newEnd = newSelection->mEnd;
  
  /* If the old or new selection is unselected, just redisplay the
   single area that is (was) selected and return */
  if (!oldSelection->mSelected && !newSelection->mSelected)
    return;
  if (!oldSelection->mSelected)
  {
    call_modify_callbacks(newStart, 0, 0, newEnd - newStart, NULL);
    return;
  }
  if (!newSelection->mSelected) {
    call_modify_callbacks(oldStart, 0, 0, oldEnd - oldStart, NULL);
    return;
  }
  
  /* If the selections are non-contiguous, do two separate updates
   and return */
  if (oldEnd < newStart || newEnd < oldStart) {
    call_modify_callbacks(oldStart, 0, 0, oldEnd - oldStart, NULL);
    call_modify_callbacks(newStart, 0, 0, newEnd - newStart, NULL);
    return;
  }
  
  /* Otherwise, separate into 3 separate regions: ch1, and ch2 (the two
   changed areas), and the unchanged area of their intersection,
   and update only the changed area(s) */
  ch1Start = min(oldStart, newStart);
  ch2End = max(oldEnd, newEnd);
  ch1End = max(oldStart, newStart);
  ch2Start = min(oldEnd, newEnd);
  if (ch1Start != ch1End)
    call_modify_callbacks(ch1Start, 0, 0, ch1End - ch1Start, NULL);
  if (ch2Start != ch2End)
    call_modify_callbacks(ch2Start, 0, 0, ch2End - ch2Start, NULL);
}